

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx::
     BVHNIntersector1<8,_16777232,_true,_embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  float *pfVar2;
  float fVar3;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  Geometry *pGVar8;
  RTCIntersectArguments *pRVar9;
  RTCRayQueryContext *pRVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [16];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined4 uVar27;
  AABBNodeMB4D *node1;
  ulong uVar28;
  undefined1 (*pauVar30) [16];
  int *piVar31;
  undefined1 (*pauVar32) [16];
  undefined1 (*pauVar33) [16];
  ulong uVar34;
  long lVar35;
  int iVar36;
  ulong uVar37;
  ulong uVar38;
  long lVar39;
  ulong uVar40;
  ulong uVar41;
  Scene *pSVar42;
  ulong uVar43;
  undefined1 auVar44 [16];
  float fVar50;
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  float fVar49;
  undefined1 auVar48 [64];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [32];
  undefined1 auVar62 [64];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  float fVar63;
  float fVar80;
  float fVar81;
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar64;
  float fVar79;
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar77;
  float fVar78;
  undefined1 auVar76 [32];
  float fVar82;
  float fVar98;
  float fVar100;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar102;
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  float fVar99;
  float fVar101;
  float fVar103;
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [64];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  float fVar104;
  float fVar117;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  float fVar105;
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  float fVar113;
  float fVar114;
  float fVar115;
  float fVar116;
  float fVar118;
  undefined1 auVar112 [64];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [32];
  undefined1 auVar128 [64];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [64];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [64];
  float fVar139;
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  float fVar148;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  float fVar146;
  float fVar147;
  undefined1 auVar145 [64];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [64];
  undefined1 auVar153 [16];
  undefined1 auVar154 [64];
  float fVar155;
  undefined1 auVar156 [16];
  float fVar158;
  float fVar159;
  float fVar160;
  undefined1 auVar157 [64];
  float fVar161;
  undefined1 auVar162 [16];
  float fVar164;
  float fVar165;
  float fVar166;
  undefined1 auVar163 [64];
  float fVar167;
  undefined1 auVar168 [16];
  float fVar170;
  float fVar171;
  float fVar172;
  undefined1 auVar169 [64];
  float fVar173;
  undefined1 auVar174 [16];
  float fVar179;
  undefined1 auVar175 [16];
  float fVar177;
  float fVar178;
  undefined1 auVar176 [64];
  float fVar180;
  float fVar182;
  float fVar183;
  float fVar184;
  undefined1 auVar181 [64];
  vbool<4> valid;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  vfloat<8> tNear;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2789;
  ulong local_2788;
  ulong local_2780;
  RayHit *local_2778;
  RayQueryContext *local_2770;
  int local_2764;
  undefined1 local_2760 [8];
  float fStack_2758;
  float fStack_2754;
  undefined8 local_2750;
  float fStack_2748;
  float fStack_2744;
  undefined1 local_2740 [16];
  RTCFilterFunctionNArguments local_2730;
  undefined1 local_2700 [16];
  float local_26f0;
  float fStack_26ec;
  float fStack_26e8;
  float fStack_26e4;
  ulong local_26d8;
  ulong local_26d0;
  ulong local_26c8;
  undefined1 (*local_26c0) [16];
  long local_26b8;
  ulong local_26b0;
  ulong local_26a8;
  float local_26a0;
  uint local_269c;
  uint local_2698;
  undefined4 local_2694;
  undefined4 local_2690;
  undefined4 local_268c;
  uint local_2688;
  uint local_2684;
  uint local_2680;
  undefined8 local_2670;
  undefined8 uStack_2668;
  undefined1 local_2660 [32];
  undefined1 local_2640 [16];
  undefined1 *local_2630;
  undefined1 local_2620 [16];
  undefined1 local_2610 [16];
  undefined1 local_2600 [16];
  undefined1 local_25f0 [16];
  undefined1 local_25e0 [16];
  undefined1 local_25d0 [16];
  undefined1 local_25c0 [2] [16];
  undefined1 local_25a0 [32];
  undefined1 local_2570 [16];
  undefined1 local_2560 [16];
  undefined1 local_2550 [16];
  undefined1 local_2540 [16];
  undefined1 local_2530 [16];
  undefined1 local_2520 [16];
  undefined1 local_2510 [16];
  undefined1 local_2500 [16];
  undefined1 local_24f0 [16];
  undefined1 local_24e0 [16];
  undefined1 local_24d0 [16];
  undefined1 local_24c0 [32];
  undefined1 local_24a0 [32];
  undefined1 local_2480 [32];
  undefined1 local_2460 [32];
  undefined1 local_2440 [32];
  undefined1 local_2420 [32];
  undefined1 local_2400 [32];
  undefined1 local_23e0 [32];
  undefined1 local_23c0 [32];
  long local_23a0;
  undefined4 uStack_2398;
  undefined1 local_2390 [9056];
  ulong uVar29;
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    local_23a0 = *(long *)&This->ptr[1].bounds.bounds0.lower.field_0;
    uStack_2398 = 0;
    if (local_23a0 != 8) {
      local_26c0 = (undefined1 (*) [16])local_2390;
      auVar93 = vmaxss_avx(ZEXT816(0) << 0x40,
                           ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
      auVar66 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->super_RayK<1>).tfar));
      aVar4 = (ray->super_RayK<1>).dir.field_0;
      auVar65._8_4_ = 0x7fffffff;
      auVar65._0_8_ = 0x7fffffff7fffffff;
      auVar65._12_4_ = 0x7fffffff;
      auVar65 = vandps_avx((undefined1  [16])aVar4,auVar65);
      auVar119._8_4_ = 0x219392ef;
      auVar119._0_8_ = 0x219392ef219392ef;
      auVar119._12_4_ = 0x219392ef;
      auVar65 = vcmpps_avx(auVar65,auVar119,1);
      auVar120._8_4_ = 0x3f800000;
      auVar120._0_8_ = &DAT_3f8000003f800000;
      auVar120._12_4_ = 0x3f800000;
      auVar119 = vdivps_avx(auVar120,(undefined1  [16])aVar4);
      auVar121._8_4_ = 0x5d5e0b6b;
      auVar121._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar121._12_4_ = 0x5d5e0b6b;
      auVar65 = vblendvps_avx(auVar119,auVar121,auVar65);
      auVar122._0_4_ = auVar65._0_4_ * 0.99999964;
      auVar122._4_4_ = auVar65._4_4_ * 0.99999964;
      auVar122._8_4_ = auVar65._8_4_ * 0.99999964;
      auVar122._12_4_ = auVar65._12_4_ * 0.99999964;
      auVar83._0_4_ = auVar65._0_4_ * 1.0000004;
      auVar83._4_4_ = auVar65._4_4_ * 1.0000004;
      auVar83._8_4_ = auVar65._8_4_ * 1.0000004;
      auVar83._12_4_ = auVar65._12_4_ * 1.0000004;
      uVar27 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
      local_23c0._4_4_ = uVar27;
      local_23c0._0_4_ = uVar27;
      local_23c0._8_4_ = uVar27;
      local_23c0._12_4_ = uVar27;
      local_23c0._16_4_ = uVar27;
      local_23c0._20_4_ = uVar27;
      local_23c0._24_4_ = uVar27;
      local_23c0._28_4_ = uVar27;
      auVar138 = ZEXT3264(local_23c0);
      uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
      local_23e0._4_4_ = uVar27;
      local_23e0._0_4_ = uVar27;
      local_23e0._8_4_ = uVar27;
      local_23e0._12_4_ = uVar27;
      local_23e0._16_4_ = uVar27;
      local_23e0._20_4_ = uVar27;
      local_23e0._24_4_ = uVar27;
      local_23e0._28_4_ = uVar27;
      auVar145 = ZEXT3264(local_23e0);
      uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
      local_2400._4_4_ = uVar27;
      local_2400._0_4_ = uVar27;
      local_2400._8_4_ = uVar27;
      local_2400._12_4_ = uVar27;
      local_2400._16_4_ = uVar27;
      local_2400._20_4_ = uVar27;
      local_2400._24_4_ = uVar27;
      local_2400._28_4_ = uVar27;
      auVar152 = ZEXT3264(local_2400);
      auVar65 = vshufps_avx(auVar122,auVar122,0);
      local_2420._16_16_ = auVar65;
      local_2420._0_16_ = auVar65;
      auVar154 = ZEXT3264(local_2420);
      auVar65 = vmovshdup_avx(auVar122);
      auVar119 = vshufps_avx(auVar122,auVar122,0x55);
      local_2440._16_16_ = auVar119;
      local_2440._0_16_ = auVar119;
      auVar157 = ZEXT3264(local_2440);
      auVar119 = vshufpd_avx(auVar122,auVar122,1);
      auVar112 = ZEXT1664(auVar119);
      auVar120 = vshufps_avx(auVar122,auVar122,0xaa);
      local_2460._16_16_ = auVar120;
      local_2460._0_16_ = auVar120;
      auVar163 = ZEXT3264(local_2460);
      auVar120 = vshufps_avx(auVar83,auVar83,0);
      local_2480._16_16_ = auVar120;
      local_2480._0_16_ = auVar120;
      auVar169 = ZEXT3264(local_2480);
      local_26c8 = (ulong)(auVar122._0_4_ < 0.0) << 5;
      auVar120 = vshufps_avx(auVar83,auVar83,0x55);
      auVar128 = ZEXT1664(auVar120);
      local_24a0._16_16_ = auVar120;
      local_24a0._0_16_ = auVar120;
      auVar132 = ZEXT3264(local_24a0);
      auVar120 = vshufps_avx(auVar83,auVar83,0xaa);
      auVar97 = ZEXT1664(auVar120);
      local_24c0._16_16_ = auVar120;
      local_24c0._0_16_ = auVar120;
      auVar176 = ZEXT3264(local_24c0);
      local_26d0 = (ulong)(auVar65._0_4_ < 0.0) << 5 | 0x40;
      local_26d8 = (ulong)(auVar119._0_4_ < 0.0) << 5 | 0x80;
      uVar37 = local_26d0 ^ 0x20;
      uVar38 = local_26d8 ^ 0x20;
      auVar65 = vshufps_avx(auVar93,auVar93,0);
      local_25a0._16_16_ = auVar65;
      local_25a0._0_16_ = auVar65;
      auVar181 = ZEXT3264(local_25a0);
      auVar65 = vshufps_avx(auVar66,auVar66,0);
      auVar48 = ZEXT3264(CONCAT1616(auVar65,auVar65));
      local_2670 = mm_lookupmask_ps._240_8_;
      uStack_2668 = mm_lookupmask_ps._248_8_;
      local_26b0 = local_26c8 ^ 0x20;
      uVar29 = local_26d8;
      uVar41 = local_26c8;
      uVar43 = local_26d0;
      local_2788 = uVar38;
      local_2780 = uVar37;
      local_2778 = ray;
      local_2770 = context;
      do {
        do {
          fVar3 = (ray->super_RayK<1>).tfar;
          auVar62 = ZEXT464((uint)fVar3);
          do {
            if (local_26c0 == (undefined1 (*) [16])&local_23a0) {
              return;
            }
            pauVar30 = local_26c0 + -1;
            local_26c0 = local_26c0 + -1;
          } while (fVar3 < *(float *)(*pauVar30 + 8));
          uVar40 = *(ulong *)*local_26c0;
          do {
            if ((uVar40 & 8) == 0) {
              uVar28 = uVar40 & 0xfffffffffffffff0;
              fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
              auVar76._4_4_ = fVar3;
              auVar76._0_4_ = fVar3;
              auVar76._8_4_ = fVar3;
              auVar76._12_4_ = fVar3;
              auVar76._16_4_ = fVar3;
              auVar76._20_4_ = fVar3;
              auVar76._24_4_ = fVar3;
              auVar76._28_4_ = fVar3;
              pfVar2 = (float *)(uVar28 + 0x100 + uVar41);
              pfVar1 = (float *)(uVar28 + 0x40 + uVar41);
              auVar61._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar61._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar61._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar61._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar61._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar61._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar61._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar61._28_4_ = auVar62._28_4_ + pfVar1[7];
              auVar61 = vsubps_avx(auVar61,auVar138._0_32_);
              auVar20._4_4_ = auVar154._4_4_ * auVar61._4_4_;
              auVar20._0_4_ = auVar154._0_4_ * auVar61._0_4_;
              auVar20._8_4_ = auVar154._8_4_ * auVar61._8_4_;
              auVar20._12_4_ = auVar154._12_4_ * auVar61._12_4_;
              auVar20._16_4_ = auVar154._16_4_ * auVar61._16_4_;
              auVar20._20_4_ = auVar154._20_4_ * auVar61._20_4_;
              auVar20._24_4_ = auVar154._24_4_ * auVar61._24_4_;
              auVar20._28_4_ = auVar61._28_4_;
              pfVar2 = (float *)(uVar28 + 0x100 + uVar43);
              pfVar1 = (float *)(uVar28 + 0x40 + uVar43);
              auVar95._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar95._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar95._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar95._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar95._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar95._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar95._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar95._28_4_ = auVar97._28_4_ + pfVar1[7];
              auVar61 = vmaxps_avx(auVar181._0_32_,auVar20);
              auVar20 = vsubps_avx(auVar95,auVar145._0_32_);
              pfVar2 = (float *)(uVar28 + 0x100 + uVar29);
              auVar19._4_4_ = auVar157._4_4_ * auVar20._4_4_;
              auVar19._0_4_ = auVar157._0_4_ * auVar20._0_4_;
              auVar19._8_4_ = auVar157._8_4_ * auVar20._8_4_;
              auVar19._12_4_ = auVar157._12_4_ * auVar20._12_4_;
              auVar19._16_4_ = auVar157._16_4_ * auVar20._16_4_;
              auVar19._20_4_ = auVar157._20_4_ * auVar20._20_4_;
              auVar19._24_4_ = auVar157._24_4_ * auVar20._24_4_;
              auVar19._28_4_ = auVar20._28_4_;
              pfVar1 = (float *)(uVar28 + 0x40 + uVar29);
              auVar110._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar110._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar110._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar110._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar110._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar110._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar110._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar110._28_4_ = auVar112._28_4_ + pfVar1[7];
              auVar20 = vsubps_avx(auVar110,auVar152._0_32_);
              auVar22._4_4_ = auVar163._4_4_ * auVar20._4_4_;
              auVar22._0_4_ = auVar163._0_4_ * auVar20._0_4_;
              auVar22._8_4_ = auVar163._8_4_ * auVar20._8_4_;
              auVar22._12_4_ = auVar163._12_4_ * auVar20._12_4_;
              auVar22._16_4_ = auVar163._16_4_ * auVar20._16_4_;
              auVar22._20_4_ = auVar163._20_4_ * auVar20._20_4_;
              fVar11 = auVar20._28_4_;
              auVar22._24_4_ = auVar163._24_4_ * auVar20._24_4_;
              auVar22._28_4_ = fVar11;
              auVar20 = vmaxps_avx(auVar19,auVar22);
              pfVar2 = (float *)(uVar28 + 0x100 + local_26b0);
              local_2660 = vmaxps_avx(auVar61,auVar20);
              auVar62 = ZEXT3264(local_2660);
              pfVar1 = (float *)(uVar28 + 0x40 + local_26b0);
              auVar96._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar96._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar96._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar96._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar96._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar96._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar96._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar96._28_4_ = fVar11 + pfVar1[7];
              auVar61 = vsubps_avx(auVar96,auVar138._0_32_);
              pfVar2 = (float *)(uVar28 + 0x100 + uVar37);
              pfVar1 = (float *)(uVar28 + 0x40 + uVar37);
              auVar111._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar111._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar111._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar111._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar111._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar111._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar111._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar111._28_4_ = fVar11 + pfVar1[7];
              auVar23._4_4_ = auVar169._4_4_ * auVar61._4_4_;
              auVar23._0_4_ = auVar169._0_4_ * auVar61._0_4_;
              auVar23._8_4_ = auVar169._8_4_ * auVar61._8_4_;
              auVar23._12_4_ = auVar169._12_4_ * auVar61._12_4_;
              auVar23._16_4_ = auVar169._16_4_ * auVar61._16_4_;
              auVar23._20_4_ = auVar169._20_4_ * auVar61._20_4_;
              auVar23._24_4_ = auVar169._24_4_ * auVar61._24_4_;
              auVar23._28_4_ = auVar61._28_4_;
              auVar61 = vsubps_avx(auVar111,auVar145._0_32_);
              pfVar2 = (float *)(uVar28 + 0x100 + uVar38);
              auVar24._4_4_ = auVar132._4_4_ * auVar61._4_4_;
              auVar24._0_4_ = auVar132._0_4_ * auVar61._0_4_;
              auVar24._8_4_ = auVar132._8_4_ * auVar61._8_4_;
              auVar24._12_4_ = auVar132._12_4_ * auVar61._12_4_;
              auVar24._16_4_ = auVar132._16_4_ * auVar61._16_4_;
              auVar24._20_4_ = auVar132._20_4_ * auVar61._20_4_;
              auVar24._24_4_ = auVar132._24_4_ * auVar61._24_4_;
              auVar24._28_4_ = auVar61._28_4_;
              pfVar1 = (float *)(uVar28 + 0x40 + uVar38);
              auVar127._0_4_ = fVar3 * *pfVar2 + *pfVar1;
              auVar127._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
              auVar127._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
              auVar127._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
              auVar127._16_4_ = fVar3 * pfVar2[4] + pfVar1[4];
              auVar127._20_4_ = fVar3 * pfVar2[5] + pfVar1[5];
              auVar127._24_4_ = fVar3 * pfVar2[6] + pfVar1[6];
              auVar127._28_4_ = auVar128._28_4_ + pfVar1[7];
              auVar61 = vsubps_avx(auVar127,auVar152._0_32_);
              auVar25._4_4_ = auVar176._4_4_ * auVar61._4_4_;
              auVar25._0_4_ = auVar176._0_4_ * auVar61._0_4_;
              auVar25._8_4_ = auVar176._8_4_ * auVar61._8_4_;
              auVar25._12_4_ = auVar176._12_4_ * auVar61._12_4_;
              auVar25._16_4_ = auVar176._16_4_ * auVar61._16_4_;
              auVar25._20_4_ = auVar176._20_4_ * auVar61._20_4_;
              auVar25._24_4_ = auVar176._24_4_ * auVar61._24_4_;
              auVar25._28_4_ = auVar61._28_4_;
              auVar128 = ZEXT3264(auVar25);
              auVar20 = vminps_avx(auVar24,auVar25);
              auVar61 = vminps_avx(auVar48._0_32_,auVar23);
              auVar61 = vminps_avx(auVar61,auVar20);
              auVar61 = vcmpps_avx(local_2660,auVar61,2);
              auVar97 = ZEXT3264(auVar61);
              if (((uint)uVar40 & 7) == 6) {
                auVar20 = vcmpps_avx(*(undefined1 (*) [32])(uVar28 + 0x1c0),auVar76,2);
                auVar19 = vcmpps_avx(auVar76,*(undefined1 (*) [32])(uVar28 + 0x1e0),1);
                auVar19 = vandps_avx(auVar20,auVar19);
                auVar61 = vandps_avx(auVar19,auVar61);
                auVar97 = ZEXT1664(auVar61._16_16_);
                auVar65 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
              }
              else {
                auVar65 = vpackssdw_avx(auVar61._0_16_,auVar61._16_16_);
              }
              auVar112 = ZEXT3264(auVar20);
              auVar65 = vpsllw_avx(auVar65,0xf);
              auVar65 = vpacksswb_avx(auVar65,auVar65);
              local_26a8 = (ulong)(byte)(SUB161(auVar65 >> 7,0) & 1 |
                                         (SUB161(auVar65 >> 0xf,0) & 1) << 1 |
                                         (SUB161(auVar65 >> 0x17,0) & 1) << 2 |
                                         (SUB161(auVar65 >> 0x1f,0) & 1) << 3 |
                                         (SUB161(auVar65 >> 0x27,0) & 1) << 4 |
                                         (SUB161(auVar65 >> 0x2f,0) & 1) << 5 |
                                         (SUB161(auVar65 >> 0x37,0) & 1) << 6 |
                                        SUB161(auVar65 >> 0x3f,0) << 7);
            }
            if ((uVar40 & 8) == 0) {
              if (local_26a8 == 0) {
                iVar36 = 4;
              }
              else {
                uVar28 = uVar40 & 0xfffffffffffffff0;
                lVar35 = 0;
                if (local_26a8 != 0) {
                  for (; (local_26a8 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                  }
                }
                iVar36 = 0;
                uVar40 = *(ulong *)(uVar28 + lVar35 * 8);
                uVar34 = local_26a8 - 1 & local_26a8;
                if (uVar34 != 0) {
                  uVar6 = *(uint *)(local_2660 + lVar35 * 4);
                  lVar35 = 0;
                  if (uVar34 != 0) {
                    for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                    }
                  }
                  uVar7 = *(ulong *)(uVar28 + lVar35 * 8);
                  uVar5 = *(uint *)(local_2660 + lVar35 * 4);
                  uVar34 = uVar34 - 1 & uVar34;
                  uVar37 = local_2780;
                  uVar38 = local_2788;
                  if (uVar34 == 0) {
                    if (uVar6 < uVar5) {
                      *(ulong *)*local_26c0 = uVar7;
                      *(uint *)(*local_26c0 + 8) = uVar5;
                      local_26c0 = local_26c0 + 1;
                    }
                    else {
                      *(ulong *)*local_26c0 = uVar40;
                      *(uint *)(*local_26c0 + 8) = uVar6;
                      local_26c0 = local_26c0 + 1;
                      uVar40 = uVar7;
                    }
                  }
                  else {
                    auVar93._8_8_ = 0;
                    auVar93._0_8_ = uVar40;
                    auVar65 = vpunpcklqdq_avx(auVar93,ZEXT416(uVar6));
                    auVar66._8_8_ = 0;
                    auVar66._0_8_ = uVar7;
                    auVar119 = vpunpcklqdq_avx(auVar66,ZEXT416(uVar5));
                    lVar35 = 0;
                    if (uVar34 != 0) {
                      for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                      }
                    }
                    auVar84._8_8_ = 0;
                    auVar84._0_8_ = *(ulong *)(uVar28 + lVar35 * 8);
                    auVar93 = vpunpcklqdq_avx(auVar84,ZEXT416(*(uint *)(local_2660 + lVar35 * 4)));
                    uVar34 = uVar34 - 1 & uVar34;
                    if (uVar34 == 0) {
                      auVar66 = vpcmpgtd_avx(auVar119,auVar65);
                      auVar120 = vpshufd_avx(auVar66,0xaa);
                      auVar66 = vblendvps_avx(auVar119,auVar65,auVar120);
                      auVar65 = vblendvps_avx(auVar65,auVar119,auVar120);
                      auVar119 = vpcmpgtd_avx(auVar93,auVar66);
                      auVar120 = vpshufd_avx(auVar119,0xaa);
                      auVar119 = vblendvps_avx(auVar93,auVar66,auVar120);
                      auVar112 = ZEXT1664(auVar119);
                      auVar93 = vblendvps_avx(auVar66,auVar93,auVar120);
                      auVar66 = vpcmpgtd_avx(auVar93,auVar65);
                      auVar120 = vpshufd_avx(auVar66,0xaa);
                      auVar97 = ZEXT1664(auVar120);
                      auVar66 = vblendvps_avx(auVar93,auVar65,auVar120);
                      auVar128 = ZEXT1664(auVar66);
                      auVar65 = vblendvps_avx(auVar65,auVar93,auVar120);
                      auVar62 = ZEXT1664(auVar65);
                      *local_26c0 = auVar65;
                      local_26c0[1] = auVar66;
                      uVar40 = auVar119._0_8_;
                      local_26c0 = local_26c0 + 2;
                    }
                    else {
                      lVar35 = 0;
                      if (uVar34 != 0) {
                        for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                        }
                      }
                      auVar128 = ZEXT464(*(uint *)(local_2660 + lVar35 * 4));
                      auVar106._8_8_ = 0;
                      auVar106._0_8_ = *(ulong *)(uVar28 + lVar35 * 8);
                      auVar66 = vpunpcklqdq_avx(auVar106,ZEXT416(*(uint *)(local_2660 + lVar35 * 4))
                                               );
                      uVar34 = uVar34 - 1 & uVar34;
                      if (uVar34 == 0) {
                        auVar120 = vpcmpgtd_avx(auVar119,auVar65);
                        auVar83 = vpshufd_avx(auVar120,0xaa);
                        auVar120 = vblendvps_avx(auVar119,auVar65,auVar83);
                        auVar65 = vblendvps_avx(auVar65,auVar119,auVar83);
                        auVar119 = vpcmpgtd_avx(auVar66,auVar93);
                        auVar83 = vpshufd_avx(auVar119,0xaa);
                        auVar119 = vblendvps_avx(auVar66,auVar93,auVar83);
                        auVar93 = vblendvps_avx(auVar93,auVar66,auVar83);
                        auVar66 = vpcmpgtd_avx(auVar93,auVar65);
                        auVar83 = vpshufd_avx(auVar66,0xaa);
                        auVar66 = vblendvps_avx(auVar93,auVar65,auVar83);
                        auVar65 = vblendvps_avx(auVar65,auVar93,auVar83);
                        auVar93 = vpcmpgtd_avx(auVar119,auVar120);
                        auVar83 = vpshufd_avx(auVar93,0xaa);
                        auVar93 = vblendvps_avx(auVar119,auVar120,auVar83);
                        auVar119 = vblendvps_avx(auVar120,auVar119,auVar83);
                        auVar120 = vpcmpgtd_avx(auVar66,auVar119);
                        auVar83 = vpshufd_avx(auVar120,0xaa);
                        auVar128 = ZEXT1664(auVar83);
                        auVar120 = vblendvps_avx(auVar66,auVar119,auVar83);
                        auVar119 = vblendvps_avx(auVar119,auVar66,auVar83);
                        *local_26c0 = auVar65;
                        local_26c0[1] = auVar119;
                        local_26c0[2] = auVar120;
                        uVar40 = auVar93._0_8_;
                        pauVar30 = local_26c0 + 3;
                      }
                      else {
                        *local_26c0 = auVar65;
                        local_26c0[1] = auVar119;
                        local_26c0[2] = auVar93;
                        local_26c0[3] = auVar66;
                        lVar35 = 0x30;
                        do {
                          lVar39 = lVar35;
                          lVar35 = 0;
                          if (uVar34 != 0) {
                            for (; (uVar34 >> lVar35 & 1) == 0; lVar35 = lVar35 + 1) {
                            }
                          }
                          auVar51._8_8_ = 0;
                          auVar51._0_8_ = *(ulong *)(uVar28 + lVar35 * 8);
                          auVar65 = vpunpcklqdq_avx(auVar51,ZEXT416(*(uint *)(local_2660 +
                                                                             lVar35 * 4)));
                          *(undefined1 (*) [16])(local_26c0[1] + lVar39) = auVar65;
                          uVar34 = uVar34 & uVar34 - 1;
                          lVar35 = lVar39 + 0x10;
                        } while (uVar34 != 0);
                        pauVar30 = (undefined1 (*) [16])(local_26c0[1] + lVar39);
                        if (lVar39 + 0x10 != 0) {
                          lVar35 = 0x10;
                          pauVar32 = local_26c0;
                          do {
                            auVar65 = pauVar32[1];
                            uVar6 = *(uint *)(pauVar32[1] + 8);
                            pauVar32 = pauVar32 + 1;
                            lVar39 = lVar35;
                            do {
                              if (uVar6 <= *(uint *)(local_26c0[-1] + lVar39 + 8)) {
                                pauVar33 = (undefined1 (*) [16])(*local_26c0 + lVar39);
                                break;
                              }
                              *(undefined1 (*) [16])(*local_26c0 + lVar39) =
                                   *(undefined1 (*) [16])(local_26c0[-1] + lVar39);
                              lVar39 = lVar39 + -0x10;
                              pauVar33 = local_26c0;
                            } while (lVar39 != 0);
                            *pauVar33 = auVar65;
                            lVar35 = lVar35 + 0x10;
                          } while (pauVar30 != pauVar32);
                        }
                        uVar40 = *(ulong *)*pauVar30;
                      }
                      auVar62 = ZEXT1664(auVar65);
                      auVar112 = ZEXT1664(auVar66);
                      auVar97 = ZEXT1664(auVar93);
                      auVar132 = ZEXT3264(auVar132._0_32_);
                      auVar176 = ZEXT3264(auVar176._0_32_);
                      auVar181 = ZEXT3264(local_25a0);
                      context = local_2770;
                      local_26c0 = pauVar30;
                      ray = local_2778;
                    }
                  }
                }
              }
            }
            else {
              iVar36 = 6;
            }
          } while (iVar36 == 0);
        } while (iVar36 != 6);
        local_26b8 = (ulong)((uint)uVar40 & 0xf) - 8;
        if (local_26b8 != 0) {
          uVar40 = uVar40 & 0xfffffffffffffff0;
          lVar35 = 0;
          do {
            lVar39 = lVar35 * 0x140;
            fVar3 = (ray->super_RayK<1>).dir.field_0.m128[3];
            pfVar2 = (float *)(uVar40 + 0x90 + lVar39);
            pfVar1 = (float *)(uVar40 + lVar39);
            auVar52._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar52._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar52._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar52._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xa0 + lVar39);
            pfVar1 = (float *)(uVar40 + 0x10 + lVar39);
            auVar67._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar67._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar67._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar67._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xb0 + lVar39);
            pfVar1 = (float *)(uVar40 + 0x20 + lVar39);
            auVar156._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar156._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar156._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar156._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xc0 + lVar39);
            pfVar1 = (float *)(uVar40 + 0x30 + lVar39);
            auVar107._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar107._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar107._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar107._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xd0 + lVar39);
            pfVar1 = (float *)(uVar40 + 0x40 + lVar39);
            auVar123._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar123._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar123._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar123._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xe0 + lVar39);
            pfVar1 = (float *)(uVar40 + 0x50 + lVar39);
            auVar162._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar162._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar162._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar162._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0xf0 + lVar39);
            pfVar1 = (float *)(uVar40 + 0x60 + lVar39);
            auVar140._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar140._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar140._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar140._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar2 = (float *)(uVar40 + 0x100 + lVar39);
            pfVar1 = (float *)(uVar40 + 0x70 + lVar39);
            auVar149._0_4_ = fVar3 * *pfVar2 + *pfVar1;
            auVar149._4_4_ = fVar3 * pfVar2[1] + pfVar1[1];
            auVar149._8_4_ = fVar3 * pfVar2[2] + pfVar1[2];
            auVar149._12_4_ = fVar3 * pfVar2[3] + pfVar1[3];
            pfVar1 = (float *)(uVar40 + 0x110 + lVar39);
            pfVar2 = (float *)(uVar40 + 0x80 + lVar39);
            auVar44._0_4_ = fVar3 * *pfVar1 + *pfVar2;
            auVar44._4_4_ = fVar3 * pfVar1[1] + pfVar2[1];
            auVar44._8_4_ = fVar3 * pfVar1[2] + pfVar2[2];
            auVar44._12_4_ = fVar3 * pfVar1[3] + pfVar2[3];
            uVar27 = *(undefined4 *)&(ray->super_RayK<1>).org.field_0;
            auVar153._4_4_ = uVar27;
            auVar153._0_4_ = uVar27;
            auVar153._8_4_ = uVar27;
            auVar153._12_4_ = uVar27;
            uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 4);
            auVar168._4_4_ = uVar27;
            auVar168._0_4_ = uVar27;
            auVar168._8_4_ = uVar27;
            auVar168._12_4_ = uVar27;
            uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 8);
            auVar174._4_4_ = uVar27;
            auVar174._0_4_ = uVar27;
            auVar174._8_4_ = uVar27;
            auVar174._12_4_ = uVar27;
            local_2700 = vsubps_avx(auVar52,auVar153);
            local_24d0 = vsubps_avx(auVar67,auVar168);
            local_24e0 = vsubps_avx(auVar156,auVar174);
            auVar65 = vsubps_avx(auVar107,auVar153);
            auVar119 = vsubps_avx(auVar123,auVar168);
            auVar93 = vsubps_avx(auVar162,auVar174);
            auVar66 = vsubps_avx(auVar140,auVar153);
            auVar120 = vsubps_avx(auVar149,auVar168);
            auVar83 = vsubps_avx(auVar44,auVar174);
            local_24f0 = vsubps_avx(auVar66,local_2700);
            local_2500 = vsubps_avx(auVar120,local_24d0);
            local_2510 = vsubps_avx(auVar83,local_24e0);
            fVar3 = local_24d0._0_4_;
            fVar63 = auVar120._0_4_ + fVar3;
            fVar13 = local_24d0._4_4_;
            fVar77 = auVar120._4_4_ + fVar13;
            fVar103 = local_24d0._8_4_;
            fVar78 = auVar120._8_4_ + fVar103;
            fVar16 = local_24d0._12_4_;
            fVar80 = auVar120._12_4_ + fVar16;
            fVar11 = local_24e0._0_4_;
            fVar104 = auVar83._0_4_ + fVar11;
            fVar99 = local_24e0._4_4_;
            fVar113 = auVar83._4_4_ + fVar99;
            fVar14 = local_24e0._8_4_;
            fVar115 = auVar83._8_4_ + fVar14;
            fVar17 = local_24e0._12_4_;
            fVar117 = auVar83._12_4_ + fVar17;
            fVar64 = local_2510._0_4_;
            auVar141._0_4_ = fVar64 * fVar63;
            fVar79 = local_2510._4_4_;
            auVar141._4_4_ = fVar79 * fVar77;
            fVar49 = local_2510._8_4_;
            auVar141._8_4_ = fVar49 * fVar78;
            fVar50 = local_2510._12_4_;
            auVar141._12_4_ = fVar50 * fVar80;
            fVar180 = local_2500._0_4_;
            auVar150._0_4_ = fVar180 * fVar104;
            fVar182 = local_2500._4_4_;
            auVar150._4_4_ = fVar182 * fVar113;
            fVar183 = local_2500._8_4_;
            auVar150._8_4_ = fVar183 * fVar115;
            fVar184 = local_2500._12_4_;
            auVar150._12_4_ = fVar184 * fVar117;
            auVar121 = vsubps_avx(auVar150,auVar141);
            fVar12 = local_2700._0_4_;
            fVar139 = auVar66._0_4_ + fVar12;
            fVar101 = local_2700._4_4_;
            fVar146 = auVar66._4_4_ + fVar101;
            fVar15 = local_2700._8_4_;
            fVar147 = auVar66._8_4_ + fVar15;
            fVar18 = local_2700._12_4_;
            fVar148 = auVar66._12_4_ + fVar18;
            fVar173 = local_24f0._0_4_;
            auVar108._0_4_ = fVar173 * fVar104;
            fVar177 = local_24f0._4_4_;
            auVar108._4_4_ = fVar177 * fVar113;
            fVar178 = local_24f0._8_4_;
            auVar108._8_4_ = fVar178 * fVar115;
            fVar179 = local_24f0._12_4_;
            auVar108._12_4_ = fVar179 * fVar117;
            auVar151._0_4_ = fVar139 * fVar64;
            auVar151._4_4_ = fVar146 * fVar79;
            auVar151._8_4_ = fVar147 * fVar49;
            auVar151._12_4_ = fVar148 * fVar50;
            auVar122 = vsubps_avx(auVar151,auVar108);
            auVar142._0_4_ = fVar180 * fVar139;
            auVar142._4_4_ = fVar182 * fVar146;
            auVar142._8_4_ = fVar183 * fVar147;
            auVar142._12_4_ = fVar184 * fVar148;
            auVar45._0_4_ = fVar173 * fVar63;
            auVar45._4_4_ = fVar177 * fVar77;
            auVar45._8_4_ = fVar178 * fVar78;
            auVar45._12_4_ = fVar179 * fVar80;
            auVar84 = vsubps_avx(auVar45,auVar142);
            local_2750._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[2];
            local_2760._4_4_ = (ray->super_RayK<1>).dir.field_0.m128[1];
            local_26f0 = (ray->super_RayK<1>).dir.field_0.m128[0];
            fStack_26ec = local_26f0;
            fStack_26e8 = local_26f0;
            fStack_26e4 = local_26f0;
            local_2540._0_4_ =
                 auVar121._0_4_ * local_26f0 +
                 (float)local_2760._4_4_ * auVar122._0_4_ + local_2750._4_4_ * auVar84._0_4_;
            local_2540._4_4_ =
                 auVar121._4_4_ * local_26f0 +
                 (float)local_2760._4_4_ * auVar122._4_4_ + local_2750._4_4_ * auVar84._4_4_;
            local_2540._8_4_ =
                 auVar121._8_4_ * local_26f0 +
                 (float)local_2760._4_4_ * auVar122._8_4_ + local_2750._4_4_ * auVar84._8_4_;
            local_2540._12_4_ =
                 auVar121._12_4_ * local_26f0 +
                 (float)local_2760._4_4_ * auVar122._12_4_ + local_2750._4_4_ * auVar84._12_4_;
            local_2520 = vsubps_avx(local_24d0,auVar119);
            auVar121 = vsubps_avx(local_24e0,auVar93);
            fVar63 = fVar3 + auVar119._0_4_;
            fVar77 = fVar13 + auVar119._4_4_;
            fVar78 = fVar103 + auVar119._8_4_;
            fVar80 = fVar16 + auVar119._12_4_;
            fVar104 = auVar93._0_4_ + fVar11;
            fVar115 = auVar93._4_4_ + fVar99;
            fVar139 = auVar93._8_4_ + fVar14;
            fVar147 = auVar93._12_4_ + fVar17;
            fVar155 = auVar121._0_4_;
            auVar175._0_4_ = fVar155 * fVar63;
            fVar158 = auVar121._4_4_;
            auVar175._4_4_ = fVar158 * fVar77;
            fVar159 = auVar121._8_4_;
            auVar175._8_4_ = fVar159 * fVar78;
            fVar160 = auVar121._12_4_;
            auVar175._12_4_ = fVar160 * fVar80;
            fVar113 = local_2520._0_4_;
            auVar85._0_4_ = fVar113 * fVar104;
            fVar117 = local_2520._4_4_;
            auVar85._4_4_ = fVar117 * fVar115;
            fVar146 = local_2520._8_4_;
            auVar85._8_4_ = fVar146 * fVar139;
            fVar148 = local_2520._12_4_;
            auVar85._12_4_ = fVar148 * fVar147;
            auVar121 = vsubps_avx(auVar85,auVar175);
            local_2530 = vsubps_avx(local_2700,auVar65);
            fVar167 = local_2530._0_4_;
            auVar109._0_4_ = fVar167 * fVar104;
            fVar170 = local_2530._4_4_;
            auVar109._4_4_ = fVar170 * fVar115;
            fVar171 = local_2530._8_4_;
            auVar109._8_4_ = fVar171 * fVar139;
            fVar172 = local_2530._12_4_;
            auVar109._12_4_ = fVar172 * fVar147;
            fVar104 = auVar65._0_4_ + fVar12;
            fVar115 = auVar65._4_4_ + fVar101;
            fVar139 = auVar65._8_4_ + fVar15;
            fVar147 = auVar65._12_4_ + fVar18;
            auVar143._0_4_ = fVar155 * fVar104;
            auVar143._4_4_ = fVar158 * fVar115;
            auVar143._8_4_ = fVar159 * fVar139;
            auVar143._12_4_ = fVar160 * fVar147;
            auVar122 = vsubps_avx(auVar143,auVar109);
            auVar133._0_4_ = fVar113 * fVar104;
            auVar133._4_4_ = fVar117 * fVar115;
            auVar133._8_4_ = fVar146 * fVar139;
            auVar133._12_4_ = fVar148 * fVar147;
            auVar46._0_4_ = fVar167 * fVar63;
            auVar46._4_4_ = fVar170 * fVar77;
            auVar46._8_4_ = fVar171 * fVar78;
            auVar46._12_4_ = fVar172 * fVar80;
            auVar84 = vsubps_avx(auVar46,auVar133);
            local_2560._0_4_ =
                 local_26f0 * auVar121._0_4_ +
                 (float)local_2760._4_4_ * auVar122._0_4_ + local_2750._4_4_ * auVar84._0_4_;
            local_2560._4_4_ =
                 local_26f0 * auVar121._4_4_ +
                 (float)local_2760._4_4_ * auVar122._4_4_ + local_2750._4_4_ * auVar84._4_4_;
            local_2560._8_4_ =
                 local_26f0 * auVar121._8_4_ +
                 (float)local_2760._4_4_ * auVar122._8_4_ + local_2750._4_4_ * auVar84._8_4_;
            local_2560._12_4_ =
                 local_26f0 * auVar121._12_4_ +
                 (float)local_2760._4_4_ * auVar122._12_4_ + local_2750._4_4_ * auVar84._12_4_;
            auVar121 = vsubps_avx(auVar65,auVar66);
            fVar82 = auVar65._0_4_ + auVar66._0_4_;
            fVar98 = auVar65._4_4_ + auVar66._4_4_;
            fVar100 = auVar65._8_4_ + auVar66._8_4_;
            fVar102 = auVar65._12_4_ + auVar66._12_4_;
            auVar65 = vsubps_avx(auVar119,auVar120);
            fVar115 = auVar119._0_4_ + auVar120._0_4_;
            fVar139 = auVar119._4_4_ + auVar120._4_4_;
            fVar147 = auVar119._8_4_ + auVar120._8_4_;
            fVar81 = auVar119._12_4_ + auVar120._12_4_;
            auVar119 = vsubps_avx(auVar93,auVar83);
            auVar112 = ZEXT1664(auVar119);
            fVar77 = auVar93._0_4_ + auVar83._0_4_;
            fVar78 = auVar93._4_4_ + auVar83._4_4_;
            fVar80 = auVar93._8_4_ + auVar83._8_4_;
            fVar104 = auVar93._12_4_ + auVar83._12_4_;
            fVar105 = auVar119._0_4_;
            auVar124._0_4_ = fVar105 * fVar115;
            fVar114 = auVar119._4_4_;
            auVar124._4_4_ = fVar114 * fVar139;
            fVar116 = auVar119._8_4_;
            auVar124._8_4_ = fVar116 * fVar147;
            fVar118 = auVar119._12_4_;
            auVar124._12_4_ = fVar118 * fVar81;
            fVar161 = auVar65._0_4_;
            auVar134._0_4_ = fVar161 * fVar77;
            fVar164 = auVar65._4_4_;
            auVar134._4_4_ = fVar164 * fVar78;
            fVar165 = auVar65._8_4_;
            auVar134._8_4_ = fVar165 * fVar80;
            fVar166 = auVar65._12_4_;
            auVar134._12_4_ = fVar166 * fVar104;
            auVar65 = vsubps_avx(auVar134,auVar124);
            fVar63 = auVar121._0_4_;
            auVar53._0_4_ = fVar63 * fVar77;
            fVar77 = auVar121._4_4_;
            auVar53._4_4_ = fVar77 * fVar78;
            fVar78 = auVar121._8_4_;
            auVar53._8_4_ = fVar78 * fVar80;
            fVar80 = auVar121._12_4_;
            auVar53._12_4_ = fVar80 * fVar104;
            auVar135._0_4_ = fVar105 * fVar82;
            auVar135._4_4_ = fVar114 * fVar98;
            auVar135._8_4_ = fVar116 * fVar100;
            auVar135._12_4_ = fVar118 * fVar102;
            auVar119 = vsubps_avx(auVar135,auVar53);
            auVar86._0_4_ = fVar161 * fVar82;
            auVar86._4_4_ = fVar164 * fVar98;
            auVar86._8_4_ = fVar165 * fVar100;
            auVar86._12_4_ = fVar166 * fVar102;
            auVar68._0_4_ = fVar63 * fVar115;
            auVar68._4_4_ = fVar77 * fVar139;
            auVar68._8_4_ = fVar78 * fVar147;
            auVar68._12_4_ = fVar80 * fVar81;
            auVar93 = vsubps_avx(auVar68,auVar86);
            local_2750._0_4_ = local_2750._4_4_;
            fStack_2748 = local_2750._4_4_;
            fStack_2744 = local_2750._4_4_;
            local_2760._0_4_ = local_2760._4_4_;
            fStack_2758 = (float)local_2760._4_4_;
            fStack_2754 = (float)local_2760._4_4_;
            auVar54._0_4_ =
                 local_26f0 * auVar65._0_4_ +
                 (float)local_2760._4_4_ * auVar119._0_4_ + local_2750._4_4_ * auVar93._0_4_;
            auVar54._4_4_ =
                 local_26f0 * auVar65._4_4_ +
                 (float)local_2760._4_4_ * auVar119._4_4_ + local_2750._4_4_ * auVar93._4_4_;
            auVar54._8_4_ =
                 local_26f0 * auVar65._8_4_ +
                 (float)local_2760._4_4_ * auVar119._8_4_ + local_2750._4_4_ * auVar93._8_4_;
            auVar54._12_4_ =
                 local_26f0 * auVar65._12_4_ +
                 (float)local_2760._4_4_ * auVar119._12_4_ + local_2750._4_4_ * auVar93._12_4_;
            local_2640._0_4_ = auVar54._0_4_ + local_2540._0_4_ + local_2560._0_4_;
            local_2640._4_4_ = auVar54._4_4_ + local_2540._4_4_ + local_2560._4_4_;
            local_2640._8_4_ = auVar54._8_4_ + local_2540._8_4_ + local_2560._8_4_;
            local_2640._12_4_ = auVar54._12_4_ + local_2540._12_4_ + local_2560._12_4_;
            auVar65 = vminps_avx(local_2540,local_2560);
            auVar65 = vminps_avx(auVar65,auVar54);
            auVar87._8_4_ = 0x7fffffff;
            auVar87._0_8_ = 0x7fffffff7fffffff;
            auVar87._12_4_ = 0x7fffffff;
            local_2550 = vandps_avx(local_2640,auVar87);
            auVar88._0_4_ = local_2550._0_4_ * 1.1920929e-07;
            auVar88._4_4_ = local_2550._4_4_ * 1.1920929e-07;
            auVar88._8_4_ = local_2550._8_4_ * 1.1920929e-07;
            auVar88._12_4_ = local_2550._12_4_ * 1.1920929e-07;
            auVar97 = ZEXT1664(auVar88);
            uVar29 = CONCAT44(auVar88._4_4_,auVar88._0_4_);
            auVar125._0_8_ = uVar29 ^ 0x8000000080000000;
            auVar125._8_4_ = -auVar88._8_4_;
            auVar125._12_4_ = -auVar88._12_4_;
            auVar65 = vcmpps_avx(auVar65,auVar125,5);
            auVar119 = vmaxps_avx(local_2540,local_2560);
            auVar128 = ZEXT1664(auVar119);
            auVar119 = vmaxps_avx(auVar119,auVar54);
            auVar119 = vcmpps_avx(auVar119,auVar88,2);
            local_2570 = vorps_avx(auVar65,auVar119);
            local_2630 = &local_2789;
            auVar21._8_8_ = uStack_2668;
            auVar21._0_8_ = local_2670;
            auVar21 = auVar21 & local_2570;
            if ((((auVar21 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                 (auVar21 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar21 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                auVar21[0xf] < '\0') {
              auVar55._0_4_ = fVar64 * fVar113;
              auVar55._4_4_ = fVar79 * fVar117;
              auVar55._8_4_ = fVar49 * fVar146;
              auVar55._12_4_ = fVar50 * fVar148;
              auVar69._0_4_ = fVar180 * fVar155;
              auVar69._4_4_ = fVar182 * fVar158;
              auVar69._8_4_ = fVar183 * fVar159;
              auVar69._12_4_ = fVar184 * fVar160;
              auVar93 = vsubps_avx(auVar69,auVar55);
              auVar89._0_4_ = fVar155 * fVar161;
              auVar89._4_4_ = fVar158 * fVar164;
              auVar89._8_4_ = fVar159 * fVar165;
              auVar89._12_4_ = fVar160 * fVar166;
              auVar126._0_4_ = fVar113 * fVar105;
              auVar126._4_4_ = fVar117 * fVar114;
              auVar126._8_4_ = fVar146 * fVar116;
              auVar126._12_4_ = fVar148 * fVar118;
              auVar66 = vsubps_avx(auVar126,auVar89);
              auVar136._8_4_ = 0x7fffffff;
              auVar136._0_8_ = 0x7fffffff7fffffff;
              auVar136._12_4_ = 0x7fffffff;
              auVar65 = vandps_avx(auVar55,auVar136);
              auVar119 = vandps_avx(auVar89,auVar136);
              auVar65 = vcmpps_avx(auVar65,auVar119,1);
              local_25e0 = vblendvps_avx(auVar66,auVar93,auVar65);
              auVar128 = ZEXT1664(local_25e0);
              auVar56._0_4_ = fVar167 * fVar105;
              auVar56._4_4_ = fVar170 * fVar114;
              auVar56._8_4_ = fVar171 * fVar116;
              auVar56._12_4_ = fVar172 * fVar118;
              auVar70._0_4_ = fVar64 * fVar167;
              auVar70._4_4_ = fVar79 * fVar170;
              auVar70._8_4_ = fVar49 * fVar171;
              auVar70._12_4_ = fVar50 * fVar172;
              auVar90._0_4_ = fVar173 * fVar155;
              auVar90._4_4_ = fVar177 * fVar158;
              auVar90._8_4_ = fVar178 * fVar159;
              auVar90._12_4_ = fVar179 * fVar160;
              auVar93 = vsubps_avx(auVar70,auVar90);
              auVar129._0_4_ = fVar155 * fVar63;
              auVar129._4_4_ = fVar158 * fVar77;
              auVar129._8_4_ = fVar159 * fVar78;
              auVar129._12_4_ = fVar160 * fVar80;
              auVar66 = vsubps_avx(auVar129,auVar56);
              auVar65 = vandps_avx(auVar90,auVar136);
              auVar119 = vandps_avx(auVar56,auVar136);
              auVar65 = vcmpps_avx(auVar65,auVar119,1);
              local_25d0 = vblendvps_avx(auVar66,auVar93,auVar65);
              auVar47._0_4_ = fVar113 * fVar63;
              auVar47._4_4_ = fVar117 * fVar77;
              auVar47._8_4_ = fVar146 * fVar78;
              auVar47._12_4_ = fVar148 * fVar80;
              auVar71._0_4_ = fVar173 * fVar113;
              auVar71._4_4_ = fVar177 * fVar117;
              auVar71._8_4_ = fVar178 * fVar146;
              auVar71._12_4_ = fVar179 * fVar148;
              auVar91._0_4_ = fVar180 * fVar167;
              auVar91._4_4_ = fVar182 * fVar170;
              auVar91._8_4_ = fVar183 * fVar171;
              auVar91._12_4_ = fVar184 * fVar172;
              auVar130._0_4_ = fVar167 * fVar161;
              auVar130._4_4_ = fVar170 * fVar164;
              auVar130._8_4_ = fVar171 * fVar165;
              auVar130._12_4_ = fVar172 * fVar166;
              auVar93 = vsubps_avx(auVar71,auVar91);
              auVar66 = vsubps_avx(auVar130,auVar47);
              auVar65 = vandps_avx(auVar91,auVar136);
              auVar119 = vandps_avx(auVar47,auVar136);
              auVar65 = vcmpps_avx(auVar65,auVar119,1);
              local_25c0[0] = vblendvps_avx(auVar66,auVar93,auVar65);
              fVar64 = local_26f0 * local_25e0._0_4_ +
                       local_25d0._0_4_ * (float)local_2760._4_4_ +
                       local_25c0[0]._0_4_ * local_2750._4_4_;
              fVar63 = local_26f0 * local_25e0._4_4_ +
                       local_25d0._4_4_ * (float)local_2760._4_4_ +
                       local_25c0[0]._4_4_ * local_2750._4_4_;
              fVar79 = local_26f0 * local_25e0._8_4_ +
                       local_25d0._8_4_ * (float)local_2760._4_4_ +
                       local_25c0[0]._8_4_ * local_2750._4_4_;
              fVar77 = local_26f0 * local_25e0._12_4_ +
                       local_25d0._12_4_ * (float)local_2760._4_4_ +
                       local_25c0[0]._12_4_ * local_2750._4_4_;
              auVar72._0_4_ = fVar64 + fVar64;
              auVar72._4_4_ = fVar63 + fVar63;
              auVar72._8_4_ = fVar79 + fVar79;
              auVar72._12_4_ = fVar77 + fVar77;
              fVar64 = local_25e0._0_4_ * fVar12 +
                       local_25d0._0_4_ * fVar3 + local_25c0[0]._0_4_ * fVar11;
              fVar99 = local_25e0._4_4_ * fVar101 +
                       local_25d0._4_4_ * fVar13 + local_25c0[0]._4_4_ * fVar99;
              fVar101 = local_25e0._8_4_ * fVar15 +
                        local_25d0._8_4_ * fVar103 + local_25c0[0]._8_4_ * fVar14;
              fVar103 = local_25e0._12_4_ * fVar18 +
                        local_25d0._12_4_ * fVar16 + local_25c0[0]._12_4_ * fVar17;
              auVar65 = vrcpps_avx(auVar72);
              fVar3 = auVar65._0_4_;
              auVar137._0_4_ = auVar72._0_4_ * fVar3;
              fVar11 = auVar65._4_4_;
              auVar137._4_4_ = auVar72._4_4_ * fVar11;
              fVar12 = auVar65._8_4_;
              auVar137._8_4_ = auVar72._8_4_ * fVar12;
              fVar13 = auVar65._12_4_;
              auVar137._12_4_ = auVar72._12_4_ * fVar13;
              auVar144._8_4_ = 0x3f800000;
              auVar144._0_8_ = &DAT_3f8000003f800000;
              auVar144._12_4_ = 0x3f800000;
              auVar65 = vsubps_avx(auVar144,auVar137);
              auVar112 = ZEXT1664(local_2560);
              local_25f0._0_4_ = (fVar64 + fVar64) * (fVar3 + fVar3 * auVar65._0_4_);
              local_25f0._4_4_ = (fVar99 + fVar99) * (fVar11 + fVar11 * auVar65._4_4_);
              local_25f0._8_4_ = (fVar101 + fVar101) * (fVar12 + fVar12 * auVar65._8_4_);
              local_25f0._12_4_ = (fVar103 + fVar103) * (fVar13 + fVar13 * auVar65._12_4_);
              uVar27 = *(undefined4 *)((long)&(ray->super_RayK<1>).org.field_0 + 0xc);
              auVar92._4_4_ = uVar27;
              auVar92._0_4_ = uVar27;
              auVar92._8_4_ = uVar27;
              auVar92._12_4_ = uVar27;
              auVar65 = vcmpps_avx(auVar92,local_25f0,2);
              fVar3 = (ray->super_RayK<1>).tfar;
              auVar131._4_4_ = fVar3;
              auVar131._0_4_ = fVar3;
              auVar131._8_4_ = fVar3;
              auVar131._12_4_ = fVar3;
              auVar119 = vcmpps_avx(local_25f0,auVar131,2);
              auVar65 = vandps_avx(auVar65,auVar119);
              auVar119 = vcmpps_avx(auVar72,_DAT_01feba10,4);
              auVar65 = vandps_avx(auVar119,auVar65);
              auVar26._8_8_ = uStack_2668;
              auVar26._0_8_ = local_2670;
              auVar119 = vandps_avx(local_2570,auVar26);
              auVar65 = vpslld_avx(auVar65,0x1f);
              auVar93 = vpsrad_avx(auVar65,0x1f);
              auVar97 = ZEXT1664(auVar93);
              auVar65 = auVar119 & auVar93;
              if ((((auVar65 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar65 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar65 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar65[0xf] < '\0') {
                auVar65 = vandps_avx(auVar93,auVar119);
                local_2660._16_16_ = local_2560;
                local_2660._0_16_ = local_2540;
                local_2630 = &local_2789;
                local_2620 = auVar65;
                pSVar42 = context->scene;
                local_2740 = auVar65;
                auVar119 = vrcpps_avx(local_2640);
                fVar3 = auVar119._0_4_;
                auVar73._0_4_ = local_2640._0_4_ * fVar3;
                fVar11 = auVar119._4_4_;
                auVar73._4_4_ = local_2640._4_4_ * fVar11;
                fVar12 = auVar119._8_4_;
                auVar73._8_4_ = local_2640._8_4_ * fVar12;
                fVar13 = auVar119._12_4_;
                auVar73._12_4_ = local_2640._12_4_ * fVar13;
                auVar94._8_4_ = 0x3f800000;
                auVar94._0_8_ = &DAT_3f8000003f800000;
                auVar94._12_4_ = 0x3f800000;
                auVar119 = vsubps_avx(auVar94,auVar73);
                auVar57._0_4_ = fVar3 + fVar3 * auVar119._0_4_;
                auVar57._4_4_ = fVar11 + fVar11 * auVar119._4_4_;
                auVar57._8_4_ = fVar12 + fVar12 * auVar119._8_4_;
                auVar57._12_4_ = fVar13 + fVar13 * auVar119._12_4_;
                auVar74._8_4_ = 0x219392ef;
                auVar74._0_8_ = 0x219392ef219392ef;
                auVar74._12_4_ = 0x219392ef;
                auVar128 = ZEXT1664(local_2550);
                auVar119 = vcmpps_avx(local_2550,auVar74,5);
                auVar119 = vandps_avx(auVar119,auVar57);
                auVar75._0_4_ = local_2540._0_4_ * auVar119._0_4_;
                auVar75._4_4_ = local_2540._4_4_ * auVar119._4_4_;
                auVar75._8_4_ = local_2540._8_4_ * auVar119._8_4_;
                auVar75._12_4_ = local_2540._12_4_ * auVar119._12_4_;
                local_2610 = vminps_avx(auVar75,auVar94);
                auVar58._0_4_ = local_2560._0_4_ * auVar119._0_4_;
                auVar58._4_4_ = local_2560._4_4_ * auVar119._4_4_;
                auVar58._8_4_ = local_2560._8_4_ * auVar119._8_4_;
                auVar58._12_4_ = local_2560._12_4_ * auVar119._12_4_;
                local_2600 = vminps_avx(auVar58,auVar94);
                auVar59._8_4_ = 0x7f800000;
                auVar59._0_8_ = 0x7f8000007f800000;
                auVar59._12_4_ = 0x7f800000;
                auVar119 = vblendvps_avx(auVar59,local_25f0,auVar65);
                auVar93 = vshufps_avx(auVar119,auVar119,0xb1);
                auVar93 = vminps_avx(auVar93,auVar119);
                auVar66 = vshufpd_avx(auVar93,auVar93,1);
                auVar97 = ZEXT1664(auVar66);
                auVar93 = vminps_avx(auVar66,auVar93);
                auVar119 = vcmpps_avx(auVar119,auVar93,0);
                auVar93 = auVar65 & auVar119;
                _local_2760 = local_25f0;
                if ((((auVar93 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar93 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar93 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar93[0xf] < '\0') {
                  auVar65 = vandps_avx(auVar119,auVar65);
                }
                lVar39 = lVar39 + uVar40;
                uVar27 = vmovmskps_avx(auVar65);
                uVar29 = CONCAT44((int)((ulong)&local_2789 >> 0x20),uVar27);
                piVar31 = (int *)0x0;
                if (uVar29 != 0) {
                  for (; (uVar29 >> (long)piVar31 & 1) == 0; piVar31 = (int *)((long)piVar31 + 1)) {
                  }
                }
                local_2750 = pSVar42;
                do {
                  uVar6 = *(uint *)(lVar39 + 0x120 + (long)piVar31 * 4);
                  pGVar8 = (pSVar42->geometries).items[uVar6].ptr;
                  if ((pGVar8->mask & (ray->super_RayK<1>).mask) == 0) {
                    *(undefined4 *)(local_2740 + (long)piVar31 * 4) = 0;
                  }
                  else {
                    pRVar9 = context->args;
                    if ((pRVar9->filter == (RTCFilterFunctionN)0x0) &&
                       (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                      fVar3 = *(float *)(local_2610 + (long)piVar31 * 4);
                      fVar11 = *(float *)(local_2600 + (long)piVar31 * 4);
                      (ray->super_RayK<1>).tfar = *(float *)(local_25f0 + (long)piVar31 * 4);
                      (ray->Ng).field_0.field_0.x = *(float *)(local_25e0 + (long)piVar31 * 4);
                      (ray->Ng).field_0.field_0.y = *(float *)(local_25d0 + (long)piVar31 * 4);
                      (ray->Ng).field_0.field_0.z = *(float *)(local_25c0[0] + (long)piVar31 * 4);
                      ray->u = fVar3;
                      ray->v = fVar11;
                      ray->primID = *(uint *)(lVar39 + 0x130 + (long)piVar31 * 4);
                      ray->geomID = uVar6;
                      pRVar10 = context->user;
                      ray->instID[0] = pRVar10->instID[0];
                      ray->instPrimID[0] = pRVar10->instPrimID[0];
                      break;
                    }
                    local_2730.context = context->user;
                    local_269c = *(uint *)(local_25d0 + (long)piVar31 * 4);
                    auVar97 = ZEXT464(local_269c);
                    local_2698 = *(uint *)(local_25c0[0] + (long)piVar31 * 4);
                    auVar112 = ZEXT464(local_2698);
                    local_26a0 = *(float *)(local_25e0 + (long)piVar31 * 4);
                    local_2694 = *(undefined4 *)(local_2610 + (long)piVar31 * 4);
                    local_2690 = *(undefined4 *)(local_2600 + (long)piVar31 * 4);
                    local_268c = *(undefined4 *)(lVar39 + 0x130 + (long)piVar31 * 4);
                    local_2688 = uVar6;
                    local_2684 = (local_2730.context)->instID[0];
                    local_2680 = (local_2730.context)->instPrimID[0];
                    local_26f0 = (ray->super_RayK<1>).tfar;
                    (ray->super_RayK<1>).tfar = *(float *)(local_25f0 + (long)piVar31 * 4);
                    local_2764 = -1;
                    local_2730.valid = &local_2764;
                    local_2730.geometryUserPtr = pGVar8->userPtr;
                    local_2730.ray = (RTCRayN *)ray;
                    local_2730.hit = (RTCHitN *)&local_26a0;
                    local_2730.N = 1;
                    if (pGVar8->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_015b3556:
                      if (pRVar9->filter != (RTCFilterFunctionN)0x0) {
                        if (((pRVar9->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                           (((pGVar8->field_8).field_0x2 & 0x40) != 0)) {
                          auVar97 = ZEXT1664(auVar97._0_16_);
                          auVar112 = ZEXT1664(auVar112._0_16_);
                          auVar128 = ZEXT1664(auVar128._0_16_);
                          (*pRVar9->filter)(&local_2730);
                          context = local_2770;
                          ray = local_2778;
                          uVar37 = local_2780;
                          uVar38 = local_2788;
                        }
                        if (*local_2730.valid == 0) goto LAB_015b364d;
                      }
                      (((Vec3f *)((long)local_2730.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_2730.hit;
                      (((Vec3f *)((long)local_2730.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_2730.hit + 4);
                      (((Vec3f *)((long)local_2730.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_2730.hit + 8);
                      *(float *)((long)local_2730.ray + 0x3c) = *(float *)(local_2730.hit + 0xc);
                      *(float *)((long)local_2730.ray + 0x40) = *(float *)(local_2730.hit + 0x10);
                      *(float *)((long)local_2730.ray + 0x44) = *(float *)(local_2730.hit + 0x14);
                      *(float *)((long)local_2730.ray + 0x48) = *(float *)(local_2730.hit + 0x18);
                      *(float *)((long)local_2730.ray + 0x4c) = *(float *)(local_2730.hit + 0x1c);
                      *(float *)((long)local_2730.ray + 0x50) = *(float *)(local_2730.hit + 0x20);
                    }
                    else {
                      local_2700._0_8_ = lVar35;
                      auVar97 = ZEXT464(local_269c);
                      auVar112 = ZEXT464(local_2698);
                      auVar128 = ZEXT1664(auVar128._0_16_);
                      (*pGVar8->intersectionFilterN)(&local_2730);
                      context = local_2770;
                      ray = local_2778;
                      lVar35 = local_2700._0_8_;
                      uVar37 = local_2780;
                      uVar38 = local_2788;
                      if (*local_2730.valid != 0) goto LAB_015b3556;
LAB_015b364d:
                      (ray->super_RayK<1>).tfar = local_26f0;
                    }
                    *(undefined4 *)(local_2740 + (long)piVar31 * 4) = 0;
                    fVar3 = (ray->super_RayK<1>).tfar;
                    auVar60._4_4_ = fVar3;
                    auVar60._0_4_ = fVar3;
                    auVar60._8_4_ = fVar3;
                    auVar60._12_4_ = fVar3;
                    auVar65 = vcmpps_avx(_local_2760,auVar60,2);
                    local_2740 = vandps_avx(auVar65,local_2740);
                    pSVar42 = local_2750;
                  }
                  if ((((local_2740 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                       (local_2740 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      (local_2740 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                      -1 < local_2740[0xf]) break;
                  auVar97 = ZEXT1664(auVar97._0_16_);
                  auVar112 = ZEXT1664(auVar112._0_16_);
                  auVar128 = ZEXT1664(auVar128._0_16_);
                  BVHNIntersector1<8,16777232,true,embree::avx::ArrayIntersector1<embree::avx::TriangleMvMBIntersector1Pluecker<4,true>>>
                  ::intersect(&local_2730);
                  context = local_2770;
                  piVar31 = local_2730.valid;
                  ray = local_2778;
                  uVar37 = local_2780;
                  uVar38 = local_2788;
                } while( true );
              }
            }
            lVar35 = lVar35 + 1;
          } while (lVar35 != local_26b8);
        }
        fVar3 = (ray->super_RayK<1>).tfar;
        auVar48 = ZEXT3264(CONCAT428(fVar3,CONCAT424(fVar3,CONCAT420(fVar3,CONCAT416(fVar3,CONCAT412
                                                  (fVar3,CONCAT48(fVar3,CONCAT44(fVar3,fVar3))))))))
        ;
        auVar138 = ZEXT3264(local_23c0);
        auVar145 = ZEXT3264(local_23e0);
        auVar152 = ZEXT3264(local_2400);
        auVar154 = ZEXT3264(local_2420);
        auVar157 = ZEXT3264(local_2440);
        auVar163 = ZEXT3264(local_2460);
        auVar169 = ZEXT3264(local_2480);
        auVar132 = ZEXT3264(local_24a0);
        auVar176 = ZEXT3264(local_24c0);
        auVar181 = ZEXT3264(local_25a0);
        uVar29 = local_26d8;
        uVar41 = local_26c8;
        uVar43 = local_26d0;
      } while( true );
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }